

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetReflectionClassName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  ulong uVar1;
  FileDescriptor *descriptor_00;
  AlphaNum *in_R8;
  string local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined1 local_38 [8];
  string result;
  FileDescriptor *descriptor_local;
  
  result.field_2._8_8_ = this;
  GetFileNamespace_abi_cxx11_((string *)local_38,this,descriptor);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_38,'.');
  }
  absl::lts_20250127::AlphaNum::AlphaNum(&local_78,"global::");
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
            );
  GetReflectionClassUnqualifiedName_abi_cxx11_
            (&local_f8,(csharp *)result.field_2._8_8_,descriptor_00);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_d8,&local_f8);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_d8,in_R8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetReflectionClassName(const FileDescriptor* descriptor) {
  std::string result = GetFileNamespace(descriptor);
  if (!result.empty()) {
    result += '.';
  }
  return absl::StrCat("global::", result,
                      GetReflectionClassUnqualifiedName(descriptor));
}